

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O0

CoverCrossSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::CoverCrossSyntax,slang::syntax::SyntaxList<slang::syntax::AttributeInstanceSyntax>const&,slang::syntax::NamedLabelSyntax*&,slang::parsing::Token&,slang::syntax::SeparatedSyntaxList<slang::syntax::IdentifierNameSyntax>const&,slang::syntax::CoverageIffClauseSyntax*&,slang::parsing::Token&,slang::syntax::SyntaxList<slang::syntax::MemberSyntax>const&,slang::parsing::Token&,slang::parsing::Token&>
          (BumpAllocator *this,SyntaxList<slang::syntax::AttributeInstanceSyntax> *args,
          NamedLabelSyntax **args_1,Token *args_2,
          SeparatedSyntaxList<slang::syntax::IdentifierNameSyntax> *args_3,
          CoverageIffClauseSyntax **args_4,Token *args_5,
          SyntaxList<slang::syntax::MemberSyntax> *args_6,Token *args_7,Token *args_8)

{
  Token closeBrace;
  Token emptySemi;
  Token cross;
  Token openBrace;
  CoverCrossSyntax *pCVar1;
  Info *in_RCX;
  Info *unaff_RBX;
  CoverageIffClauseSyntax *in_RSI;
  undefined8 in_RDI;
  undefined8 in_R8;
  CoverCrossSyntax *in_R9;
  SyntaxList<slang::syntax::MemberSyntax> *unaff_R14;
  undefined8 unaff_retaddr;
  Info *in_stack_00000008;
  undefined8 in_stack_00000010;
  Info *in_stack_00000018;
  size_t in_stack_ffffffffffffff48;
  size_t in_stack_ffffffffffffff50;
  BumpAllocator *in_stack_ffffffffffffff58;
  
  pCVar1 = (CoverCrossSyntax *)
           allocate(in_stack_ffffffffffffff58,in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
  cross.info = in_RCX;
  cross.kind = (short)in_R8;
  cross._2_1_ = (char)((ulong)in_R8 >> 0x10);
  cross.numFlags.raw = (char)((ulong)in_R8 >> 0x18);
  cross.rawLen = (int)((ulong)in_R8 >> 0x20);
  openBrace.info = unaff_RBX;
  openBrace.kind = (short)in_RDI;
  openBrace._2_1_ = (char)((ulong)in_RDI >> 0x10);
  openBrace.numFlags.raw = (char)((ulong)in_RDI >> 0x18);
  openBrace.rawLen = (int)((ulong)in_RDI >> 0x20);
  closeBrace.info = in_stack_00000008;
  closeBrace.kind = (short)unaff_retaddr;
  closeBrace._2_1_ = (char)((ulong)unaff_retaddr >> 0x10);
  closeBrace.numFlags.raw = (char)((ulong)unaff_retaddr >> 0x18);
  closeBrace.rawLen = (int)((ulong)unaff_retaddr >> 0x20);
  emptySemi.info = in_stack_00000018;
  emptySemi._0_8_ = in_stack_00000010;
  slang::syntax::CoverCrossSyntax::CoverCrossSyntax
            (in_R9,(SyntaxList<slang::syntax::AttributeInstanceSyntax> *)in_RCX->location,
             (NamedLabelSyntax *)in_RCX->rawTextPtr,cross,
             (SeparatedSyntaxList<slang::syntax::IdentifierNameSyntax> *)in_stack_00000008->location
             ,in_RSI,openBrace,unaff_R14,closeBrace,emptySemi);
  return pCVar1;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }